

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

void __thiscall icu_63::ReorderingBuffer::removeSuffix(ReorderingBuffer *this,int32_t suffixLength)

{
  UChar *pUVar1;
  int32_t iVar2;
  
  pUVar1 = this->start;
  if ((long)suffixLength < (long)this->limit - (long)pUVar1 >> 1) {
    pUVar1 = this->limit + -(long)suffixLength;
    this->limit = pUVar1;
    this->remainingCapacity = this->remainingCapacity + suffixLength;
  }
  else {
    this->limit = pUVar1;
    iVar2 = 0x1b;
    if (((this->str->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      iVar2 = (this->str->fUnion).fFields.fCapacity;
    }
    this->remainingCapacity = iVar2;
  }
  this->lastCC = '\0';
  this->reorderStart = pUVar1;
  return;
}

Assistant:

void ReorderingBuffer::removeSuffix(int32_t suffixLength) {
    if(suffixLength<(limit-start)) {
        limit-=suffixLength;
        remainingCapacity+=suffixLength;
    } else {
        limit=start;
        remainingCapacity=str.getCapacity();
    }
    lastCC=0;
    reorderStart=limit;
}